

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

QJsonValue * QJsonValue::fromVariant(QJsonValue *__return_storage_ptr__,QVariant *variant)

{
  bool bVar1;
  int iVar2;
  qlonglong v;
  qulonglong qVar3;
  long in_FS_OFFSET;
  double v_00;
  QJsonDocument doc;
  anon_union_24_3_e3d07ef4_for_data local_30;
  
  local_30._16_8_ = *(long *)(in_FS_OFFSET + 0x28);
  doc.d._M_t.super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
  ._M_t.super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
  super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
       (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
       ::QVariant::metaType(variant);
  iVar2 = QMetaType::registerHelper((QMetaType *)&doc);
  switch(iVar2) {
  case 1:
    bVar1 = ::QVariant::toBool(variant);
    QJsonValue(__return_storage_ptr__,bVar1);
    break;
  case 2:
  case 3:
  case 4:
  case 0x20:
  case 0x21:
  case 0x24:
    goto switchD_002c7edd_caseD_2;
  case 5:
  case 0x23:
    qVar3 = ::QVariant::toULongLong(variant,(bool *)0x0);
    if ((long)qVar3 < 0) goto switchD_002c7edd_caseD_6;
    goto switchD_002c7edd_caseD_2;
  case 6:
  case 0x26:
  case 0x3f:
switchD_002c7edd_caseD_6:
    v_00 = ::QVariant::toDouble(variant,(bool *)0x0);
    if ((ulong)ABS(v_00) < 0x7ff0000000000000) {
      QJsonValue(__return_storage_ptr__,v_00);
      break;
    }
  case 0x33:
    QJsonValue(__return_storage_ptr__,Null);
    break;
  default:
    doc.d._M_t.
    super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
         (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
         &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toString((QString *)&doc,variant);
    QJsonValue(__return_storage_ptr__,(QString *)&doc);
    goto LAB_002c82bc;
  case 8:
    ::QVariant::toMap((QVariant *)&local_30);
    QJsonObject::fromVariantMap((QJsonObject *)&doc,(QVariantMap *)&local_30.shared);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)&doc);
    QJsonObject::~QJsonObject((QJsonObject *)&doc);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                *)&local_30.shared);
    break;
  case 9:
    ::QVariant::toList((QVariantList *)&doc,variant);
    QJsonArray::fromVariantList((QJsonArray *)&local_30.shared,(QVariantList *)&doc);
    QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_30.shared);
    QJsonArray::~QJsonArray((QJsonArray *)&local_30.shared);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&doc);
    break;
  case 10:
    ::QVariant::toString((QString *)&doc,variant);
    QJsonValue(__return_storage_ptr__,(QString *)&doc);
    goto LAB_002c82bc;
  case 0xb:
    ::QVariant::toStringList((QStringList *)&doc,variant);
    QJsonArray::fromStringList((QJsonArray *)&local_30.shared,(QStringList *)&doc);
    QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_30.shared);
    QJsonArray::~QJsonArray((QJsonArray *)&local_30.shared);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&doc);
    break;
  case 0x11:
    ::QVariant::toUrl((QVariant *)&local_30);
    QUrl::toString((QString *)&doc,(QUrl *)&local_30.shared,(FormattingOptions)0x1f00000);
    QJsonValue(__return_storage_ptr__,(QString *)&doc);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&doc);
    QUrl::~QUrl((QUrl *)&local_30.shared);
    break;
  case 0x1c:
    ::QVariant::toHash((QVariant *)&local_30);
    QJsonObject::fromVariantHash((QJsonObject *)&doc,(QVariantHash *)&local_30.shared);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)&doc);
    QJsonObject::~QJsonObject((QJsonObject *)&doc);
    QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&local_30.shared);
    break;
  case 0x1e:
    local_30._0_16_ = (undefined1  [16])::QVariant::toUuid(variant);
    QUuid::toString((QString *)&doc,(QUuid *)&local_30,WithoutBraces);
    QJsonValue(__return_storage_ptr__,(QString *)&doc);
LAB_002c82bc:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&doc);
    break;
  case 0x2d:
    ::QVariant::toJsonValue(__return_storage_ptr__,variant);
    break;
  case 0x2e:
    ::QVariant::toJsonObject((QVariant *)&doc);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)&doc);
    QJsonObject::~QJsonObject((QJsonObject *)&doc);
    break;
  case 0x2f:
    ::QVariant::toJsonArray((QVariant *)&doc);
    QJsonValue(__return_storage_ptr__,(QJsonArray *)&doc);
    QJsonArray::~QJsonArray((QJsonArray *)&doc);
    break;
  case 0x30:
    doc.d._M_t.
    super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
         (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
         &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toJsonDocument((QVariant *)&doc);
    bVar1 = QJsonDocument::isArray(&doc);
    if (bVar1) {
      QJsonDocument::array((QJsonDocument *)&local_30.shared);
      QJsonValue(__return_storage_ptr__,(QJsonArray *)&local_30.shared);
      QJsonArray::~QJsonArray((QJsonArray *)&local_30.shared);
    }
    else {
      QJsonDocument::object((QJsonDocument *)&local_30.shared);
      QJsonValue(__return_storage_ptr__,(QJsonObject *)&local_30.shared);
      QJsonObject::~QJsonObject((QJsonObject *)&local_30.shared);
    }
    QJsonDocument::~QJsonDocument(&doc);
    break;
  case 0x35:
    qvariant_cast<QCborValue>((QCborValue *)&doc,variant);
    QCborValue::toJsonValue(__return_storage_ptr__,(QCborValue *)&doc);
    QCborValue::~QCborValue((QCborValue *)&doc);
    break;
  case 0x36:
    qvariant_cast<QCborArray>((QVariant *)&local_30);
    QCborArray::toJsonArray((QCborArray *)&doc);
    QJsonValue(__return_storage_ptr__,(QJsonArray *)&doc);
    QJsonArray::~QJsonArray((QJsonArray *)&doc);
    QCborArray::~QCborArray((QCborArray *)&local_30.shared);
    break;
  case 0x37:
    qvariant_cast<QCborMap>((QVariant *)&local_30);
    QCborMap::toJsonObject((QCborMap *)&doc);
    QJsonValue(__return_storage_ptr__,(QJsonObject *)&doc);
    QJsonObject::~QJsonObject((QJsonObject *)&doc);
    QCborMap::~QCborMap((QCborMap *)&local_30.shared);
  }
LAB_002c82c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30._16_8_) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
switchD_002c7edd_caseD_2:
  v = ::QVariant::toLongLong(variant,(bool *)0x0);
  QJsonValue(__return_storage_ptr__,v);
  goto LAB_002c82c4;
}

Assistant:

QJsonValue QJsonValue::fromVariant(const QVariant &variant)
{
    switch (variant.metaType().id()) {
    case QMetaType::Nullptr:
        return QJsonValue(Null);
    case QMetaType::Bool:
        return QJsonValue(variant.toBool());
    case QMetaType::Short:
    case QMetaType::UShort:
    case QMetaType::Int:
    case QMetaType::UInt:
    case QMetaType::Long:
    case QMetaType::LongLong:
        return QJsonValue(variant.toLongLong());
    case QMetaType::ULong:
    case QMetaType::ULongLong:
        if (variant.toULongLong() <= static_cast<uint64_t>(std::numeric_limits<qint64>::max()))
            return QJsonValue(variant.toLongLong());
        Q_FALLTHROUGH();
    case QMetaType::Float16:
    case QMetaType::Float:
    case QMetaType::Double: {
        double v = variant.toDouble();
        return qt_is_finite(v) ? QJsonValue(v) : QJsonValue();
    }
    case QMetaType::QString:
        return QJsonValue(variant.toString());
    case QMetaType::QStringList:
        return QJsonValue(QJsonArray::fromStringList(variant.toStringList()));
    case QMetaType::QVariantList:
        return QJsonValue(QJsonArray::fromVariantList(variant.toList()));
    case QMetaType::QVariantMap:
        return QJsonValue(QJsonObject::fromVariantMap(variant.toMap()));
    case QMetaType::QVariantHash:
        return QJsonValue(QJsonObject::fromVariantHash(variant.toHash()));
#ifndef QT_BOOTSTRAPPED
    case QMetaType::QUrl:
        return QJsonValue(variant.toUrl().toString(QUrl::FullyEncoded));
    case QMetaType::QUuid:
        return variant.toUuid().toString(QUuid::WithoutBraces);
    case QMetaType::QJsonValue:
        return variant.toJsonValue();
    case QMetaType::QJsonObject:
        return variant.toJsonObject();
    case QMetaType::QJsonArray:
        return variant.toJsonArray();
    case QMetaType::QJsonDocument: {
        QJsonDocument doc = variant.toJsonDocument();
        return doc.isArray() ? QJsonValue(doc.array()) : QJsonValue(doc.object());
    }
    case QMetaType::QCborValue:
        return qvariant_cast<QCborValue>(variant).toJsonValue();
    case QMetaType::QCborArray:
        return qvariant_cast<QCborArray>(variant).toJsonArray();
    case QMetaType::QCborMap:
        return qvariant_cast<QCborMap>(variant).toJsonObject();
#endif
    default:
        break;
    }
    QString string = variant.toString();
    if (string.isEmpty())
        return QJsonValue();
    return QJsonValue(string);
}